

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlValidBuildContentModel(void)

{
  int iVar1;
  int iVar2;
  xmlValidCtxtPtr val;
  int local_34;
  int n_elem;
  xmlElementPtr elem;
  int n_ctxt;
  xmlValidCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (elem._4_4_ = 0; (int)elem._4_4_ < 2; elem._4_4_ = elem._4_4_ + 1) {
    for (local_34 = 0; local_34 < 1; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlValidCtxtPtr(elem._4_4_,0);
      iVar2 = xmlValidBuildContentModel(val,0);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlValidCtxtPtr(elem._4_4_,val,0);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidBuildContentModel",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)elem._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlValidBuildContentModel(void) {
    int test_ret = 0;

#if defined(LIBXML_VALID_ENABLED) && defined(LIBXML_REGEXP_ENABLED)
    int mem_base;
    int ret_val;
    xmlValidCtxtPtr ctxt; /* a validation context */
    int n_ctxt;
    xmlElementPtr elem; /* an element declaration node */
    int n_elem;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlValidCtxtPtr;n_ctxt++) {
    for (n_elem = 0;n_elem < gen_nb_xmlElementPtr;n_elem++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlValidCtxtPtr(n_ctxt, 0);
        elem = gen_xmlElementPtr(n_elem, 1);

        ret_val = xmlValidBuildContentModel(ctxt, elem);
        desret_int(ret_val);
        call_tests++;
        des_xmlValidCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlElementPtr(n_elem, elem, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlValidBuildContentModel",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_elem);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}